

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O2

void tif_14uto32s(OPJ_BYTE *pSrc,OPJ_INT32 *pDst,OPJ_SIZE_T length)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  ulong uVar7;
  int iVar8;
  byte *pbVar9;
  
  pbVar9 = pSrc + 6;
  for (uVar7 = 0; uVar7 < (length & 0xfffffffffffffffc); uVar7 = uVar7 + 4) {
    bVar1 = pbVar9[-5];
    bVar2 = pbVar9[-4];
    bVar3 = pbVar9[-3];
    bVar4 = pbVar9[-2];
    bVar5 = pbVar9[-1];
    bVar6 = *pbVar9;
    pDst[uVar7] = (uint)(bVar1 >> 2) | (uint)pbVar9[-6] << 6;
    pDst[uVar7 + 1] = (uint)(bVar3 >> 4) | (uint)bVar2 << 4 | (bVar1 & 3) << 0xc;
    pDst[uVar7 + 2] = (uint)(bVar5 >> 6) | (bVar3 & 0xf) * 0x400 + (uint)bVar4 * 4;
    pDst[uVar7 + 3] = (bVar5 & 0x3f) << 8 | (uint)bVar6;
    pbVar9 = pbVar9 + 7;
  }
  if ((length & 3) != 0) {
    bVar1 = pbVar9[-5];
    pDst[uVar7] = (uint)(bVar1 >> 2) | (uint)pbVar9[-6] << 6;
    iVar8 = (int)(length & 3);
    if (iVar8 != 1) {
      bVar2 = pbVar9[-3];
      pDst[uVar7 + 1] = (uint)(bVar2 >> 4) | (uint)pbVar9[-4] << 4 | (bVar1 & 3) << 0xc;
      if (iVar8 == 3) {
        pDst[uVar7 + 2] = (uint)(pbVar9[-1] >> 6) | (bVar2 & 0xf) * 0x400 + (uint)pbVar9[-2] * 4;
      }
    }
  }
  return;
}

Assistant:

static void tif_14uto32s(const OPJ_BYTE* pSrc, OPJ_INT32* pDst,
                         OPJ_SIZE_T length)
{
    OPJ_SIZE_T i;
    for (i = 0; i < (length & ~(OPJ_SIZE_T)3U); i += 4U) {
        OPJ_UINT32 val0 = *pSrc++;
        OPJ_UINT32 val1 = *pSrc++;
        OPJ_UINT32 val2 = *pSrc++;
        OPJ_UINT32 val3 = *pSrc++;
        OPJ_UINT32 val4 = *pSrc++;
        OPJ_UINT32 val5 = *pSrc++;
        OPJ_UINT32 val6 = *pSrc++;

        pDst[i + 0] = (OPJ_INT32)((val0 << 6) | (val1 >> 2));
        pDst[i + 1] = (OPJ_INT32)(((val1 & 0x3U) << 12) | (val2 << 4) | (val3 >> 4));
        pDst[i + 2] = (OPJ_INT32)(((val3 & 0xFU) << 10) | (val4 << 2) | (val5 >> 6));
        pDst[i + 3] = (OPJ_INT32)(((val5 & 0x3FU) << 8) | val6);

    }
    if (length & 3U) {
        OPJ_UINT32 val0 = *pSrc++;
        OPJ_UINT32 val1 = *pSrc++;
        length = length & 3U;
        pDst[i + 0] = (OPJ_INT32)((val0 << 6) | (val1 >> 2));

        if (length > 1U) {
            OPJ_UINT32 val2 = *pSrc++;
            OPJ_UINT32 val3 = *pSrc++;
            pDst[i + 1] = (OPJ_INT32)(((val1 & 0x3U) << 12) | (val2 << 4) | (val3 >> 4));
            if (length > 2U) {
                OPJ_UINT32 val4 = *pSrc++;
                OPJ_UINT32 val5 = *pSrc++;
                pDst[i + 2] = (OPJ_INT32)(((val3 & 0xFU) << 10) | (val4 << 2) | (val5 >> 6));
            }
        }
    }
}